

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_router.hpp
# Opt level: O0

void __thiscall
cinatra::coro_http_router::
set_http_handler<(cinatra::http_method)1,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>
          (coro_http_router *this,string *key,
          function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *handler)

{
  size_type sVar1;
  type_conflict3 *ptVar2;
  null_logger_t *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  long in_RDI;
  type_conflict3 *ok;
  type *it;
  string pattern;
  string method_str;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> http_handler;
  string whole_str;
  string_view method_name;
  function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>
  *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  string *in_stack_fffffffffffffe00;
  allocator<char> *in_stack_fffffffffffffe10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  allocator<char> local_129 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_101 [3];
  allocator<char> local_99 [113];
  undefined8 local_28;
  char *pcStack_20;
  
  local_28 = 3;
  pcStack_20 = "GET";
  std::__cxx11::string::string(in_stack_fffffffffffffdf0);
  std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
            (in_stack_fffffffffffffe00,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_stack_fffffffffffffdf0,
             (char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (in_stack_fffffffffffffdf0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::function
            ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
             in_stack_fffffffffffffde0);
  std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::operator=
            ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
             in_stack_fffffffffffffe00,
             (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
             CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                    (in_stack_fffffffffffffe20,(char)((ulong)in_stack_fffffffffffffe18 >> 0x38),
                     (size_type)in_stack_fffffffffffffe10);
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (in_stack_fffffffffffffe00,
                       (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                       (size_type)in_stack_fffffffffffffdf0);
    if ((sVar1 == 0xffffffffffffffff) &&
       (sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                find(in_stack_fffffffffffffe00,
                     (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                     (size_type)in_stack_fffffffffffffdf0), sVar1 == 0xffffffffffffffff)) {
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::emplace<std::__cxx11::string>
                ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      std::get<0ul,std::_Rb_tree_const_iterator<std::__cxx11::string>,bool>
                ((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                  *)0x413b0e);
      ptVar2 = std::get<1ul,std::_Rb_tree_const_iterator<std::__cxx11::string>,bool>
                         ((pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
                           *)0x413b23);
      if ((*ptVar2 & 1U) == 0) {
        this_00 = null_logger_t::operator<<((null_logger_t *)&NULL_LOGGER,in_RSI);
        null_logger_t::operator<<(this_00,(char (*) [25])" has already registered.");
      }
      else {
        in_stack_fffffffffffffde0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x30);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x413b80);
        std::
        unordered_map<std::basic_string_view<char,std::char_traits<char>>,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>>>
        ::
        emplace<std::__cxx11::string_const&,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>
                  ((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>_>_>_>
                    *)in_stack_fffffffffffffdf0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                   (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                   in_stack_fffffffffffffde0);
      }
    }
    else {
      std::__cxx11::string::string(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
      sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        (in_stack_fffffffffffffe00,
                         (char *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                         (size_type)in_stack_fffffffffffffdf0);
      if (sVar1 != 0xffffffffffffffff) {
        in_stack_fffffffffffffe18 = local_101;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                   in_stack_fffffffffffffe10);
        in_stack_fffffffffffffe10 = local_129;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
                   in_stack_fffffffffffffe10);
        replace_all(in_stack_fffffffffffffe00,
                    (string *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8),
                    in_stack_fffffffffffffdf0);
        std::__cxx11::string::~string(in_stack_fffffffffffffde0);
        std::allocator<char>::~allocator(local_129);
        std::__cxx11::string::~string(in_stack_fffffffffffffde0);
        std::allocator<char>::~allocator((allocator<char> *)local_101);
      }
      std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
      basic_regex<std::char_traits<char>,std::allocator<char>>
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffe20,
                 in_stack_fffffffffffffe18,(flag_type)((ulong)in_stack_fffffffffffffe10 >> 0x20));
      std::
      vector<std::tuple<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>,std::allocator<std::tuple<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>>>
      ::
      emplace_back<std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>,std::function<void(cinatra::coro_http_request&,cinatra::coro_http_response&)>>
                ((vector<std::tuple<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>_>,_std::allocator<std::tuple<std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>,_std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>_>_>_>
                  *)in_stack_fffffffffffffdf0,
                 (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)
                 CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                 (function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
                 in_stack_fffffffffffffde0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)in_stack_fffffffffffffde0);
      std::__cxx11::string::~string(in_stack_fffffffffffffde0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_fffffffffffffe20,
               (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe18,
               in_stack_fffffffffffffe10);
    std::allocator<char>::~allocator(local_99);
    std::__shared_ptr_access<cinatra::radix_tree,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cinatra::radix_tree,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x413770);
    std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::function
              ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
               in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
    radix_tree::insert((radix_tree *)this,key,handler,(string *)method_name._M_str);
    std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::~function
              ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
               0x4137bd);
    std::__cxx11::string::~string(in_stack_fffffffffffffde0);
  }
  std::function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)>::~function
            ((function<void_(cinatra::coro_http_request_&,_cinatra::coro_http_response_&)> *)
             0x413bd2);
  std::__cxx11::string::~string(in_stack_fffffffffffffde0);
  return;
}

Assistant:

void set_http_handler(std::string key, Func handler, Aspects&&... asps) {
    constexpr auto method_name = cinatra::method_name(method);
    std::string whole_str;
    whole_str.append(method_name).append(" ").append(key);

    // hold keys to make sure map_handles_ key is
    // std::string_view, avoid memcpy when route
    using return_type = typename util::function_traits<Func>::return_type;
    if constexpr (coro_io::is_lazy_v<return_type>) {
      std::function<async_simple::coro::Lazy<void>(coro_http_request & req,
                                                   coro_http_response & resp)>
          http_handler;
      if constexpr (sizeof...(Aspects) > 0) {
        http_handler = [this, handler = std::move(handler),
                        ... asps = std::forward<Aspects>(asps)](
                           coro_http_request& req,
                           coro_http_response& resp) mutable
            -> async_simple::coro::Lazy<void> {
          bool ok = true;
          (do_before(asps, req, resp, ok), ...);
          if (ok) {
            co_await handler(req, resp);
          }
          ok = true;
          (do_after(asps, req, resp, ok), ...);
        };
      }
      else {
        http_handler = std::move(handler);
      }

      if (whole_str.find(":") != std::string::npos) {
        std::string method_str(method_name);
        coro_router_tree_->coro_insert(whole_str, std::move(http_handler),
                                       method_str);
      }
      else {
        if (whole_str.find("{") != std::string::npos ||
            whole_str.find(")") != std::string::npos) {
          std::string pattern = whole_str;

          if (pattern.find("{}") != std::string::npos) {
            replace_all(pattern, "{}", "([^/]+)");
          }

          coro_regex_handles_.emplace_back(std::regex(pattern),
                                           std::move(http_handler));
        }
        else {
          auto [it, ok] = coro_keys_.emplace(std::move(whole_str));
          if (!ok) {
            CINATRA_LOG_WARNING << key << " has already registered.";
            return;
          }
          coro_handles_.emplace(*it, std::move(http_handler));
        }
      }
    }
    else {
      std::function<void(coro_http_request & req, coro_http_response & resp)>
          http_handler;
      if constexpr (sizeof...(Aspects) > 0) {
        http_handler = [this, handler = std::move(handler),
                        ... asps = std::forward<Aspects>(asps)](
                           coro_http_request& req,
                           coro_http_response& resp) mutable {
          bool ok = true;
          (do_before(asps, req, resp, ok), ...);
          if (ok) {
            handler(req, resp);
          }
          ok = true;
          (do_after(asps, req, resp, ok), ...);
        };
      }
      else {
        http_handler = std::move(handler);
      }

      if (whole_str.find(':') != std::string::npos) {
        std::string method_str(method_name);
        router_tree_->insert(whole_str, std::move(http_handler), method_str);
      }
      else if (whole_str.find("{") != std::string::npos ||
               whole_str.find(")") != std::string::npos) {
        std::string pattern = whole_str;

        if (pattern.find("{}") != std::string::npos) {
          replace_all(pattern, "{}", "([^/]+)");
        }

        regex_handles_.emplace_back(std::regex(pattern),
                                    std::move(http_handler));
      }
      else {
        auto [it, ok] = keys_.emplace(std::move(whole_str));
        if (!ok) {
          CINATRA_LOG_WARNING << key << " has already registered.";
          return;
        }
        map_handles_.emplace(*it, std::move(http_handler));
      }
    }
  }